

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.c
# Opt level: O3

piga_event_queue *
piga_event_queue_create_default_in_shm
          (int *shm_id,piga_status *status,piga_event_queue *host_queue,char *name,int name_length)

{
  __pid_t _Var1;
  piga_event_queue *ppVar2;
  piga_event *ev;
  piga_event_consumer_registered *ev_00;
  
  _Var1 = getpid();
  ppVar2 = piga_event_queue_create_in_shm(_Var1 + 0x1b62,shm_id,status);
  if (*status == PIGA_STATUS_OK) {
    ev = piga_event_create();
    piga_event_set_type(ev,PIGA_EVENT_CONSUMER_REGISTERED);
    ev_00 = piga_event_get_consumer_registered(ev);
    piga_event_consumer_registered_set_shm_key(ev_00,_Var1 + 0x1b62);
    piga_event_consumer_registered_set_name(ev_00,name,name_length);
    piga_event_queue_push(host_queue,ev);
    piga_event_free(ev);
  }
  return ppVar2;
}

Assistant:

piga_event_queue* piga_event_queue_create_default_in_shm(int* shm_id, piga_status* status, piga_event_queue *host_queue, const char *name, int name_length)
{
    int shm_key = piga_event_queue_get_default_process_shm_key();
    
    piga_event_queue *queue = piga_event_queue_create_in_shm(
        shm_key,
        shm_id,
        status
    );
    
    if(*status == PIGA_STATUS_OK) {
        piga_event *ev = piga_event_create();
        
        piga_event_set_type(ev, PIGA_EVENT_CONSUMER_REGISTERED);
        
        piga_event_consumer_registered *consumer_registered = piga_event_get_consumer_registered(ev);
        piga_event_consumer_registered_set_shm_key(consumer_registered, shm_key);
        piga_event_consumer_registered_set_name(consumer_registered, name, name_length);
        
        piga_event_queue_push(host_queue, ev);
        
        piga_event_free(ev);
    }
    
    return queue;
}